

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O1

void __thiscall QFontDialog::setOption(QFontDialog *this,FontDialogOption option,bool on)

{
  FontDialogOption FVar1;
  
  FVar1 = QFontDialogOptions::options();
  if (((FVar1 & option) == 0) != on) {
    return;
  }
  setOptions(this,(FontDialogOptions)(FVar1 ^ option));
  return;
}

Assistant:

void QFontDialog::setOption(FontDialogOption option, bool on)
{
    const QFontDialog::FontDialogOptions previousOptions = options();
    if (!(previousOptions & option) != !on)
        setOptions(previousOptions ^ option);
}